

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  Parameters PVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  long *plVar6;
  char *__s;
  EVP_PKEY_CTX *ctx;
  long lVar7;
  string httpRoot;
  State state;
  Parameters parameters;
  undefined1 in_stack_fffffffffffffe18 [12];
  undefined4 in_stack_fffffffffffffe24;
  float fVar8;
  undefined1 *puVar9;
  undefined1 *puVar10;
  long in_stack_fffffffffffffe30;
  long in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  long *plVar11;
  undefined1 in_stack_fffffffffffffe50 [24];
  long in_stack_fffffffffffffe68;
  long in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe78 [16];
  float in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8c [28];
  undefined1 local_150 [24];
  _Alloc_hider local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  pointer local_118;
  pointer pbStack_110;
  pointer local_108;
  _Alloc_hider local_100;
  size_type local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  _Alloc_hider local_e0;
  size_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  Parameters local_c0;
  
  printf("Usage: %s [port] [httpRoot] [nBalls]\n",*argv);
  iVar2 = 3000;
  if (1 < argc) {
    iVar2 = atoi(argv[1]);
  }
  if (argc < 3) {
    __s = "../examples";
  }
  else {
    __s = argv[2];
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffe68,__s,(allocator<char> *)local_150);
  uVar3 = 0x40;
  if (3 < argc) {
    uVar3 = atoi(argv[3]);
  }
  State::State((State *)&stack0xfffffffffffffe88);
  uVar4 = 0x80;
  if ((int)uVar3 < 0x80) {
    uVar4 = uVar3;
  }
  ctx = (EVP_PKEY_CTX *)0x1;
  if (1 < (int)uVar4) {
    ctx = (EVP_PKEY_CTX *)(ulong)uVar4;
  }
  State::init((State *)&stack0xfffffffffffffe88,ctx);
  local_138._M_p = (pointer)&local_128;
  local_150._4_4_ = 0x40000;
  local_150._8_8_ = 3000;
  local_150._16_4_ = 0x78;
  local_128._M_allocated_capacity._0_2_ = 0x2e;
  local_130 = 1;
  local_118 = (pointer)0x0;
  pbStack_110 = (pointer)0x0;
  local_108 = (pointer)0x0;
  local_100._M_p = (pointer)&local_f0;
  local_f0._M_allocated_capacity._0_4_ = 0x2e79656b;
  local_f0._M_allocated_capacity._4_3_ = 0x6d6570;
  local_f8 = 7;
  local_f0._M_local_buf[7] = '\0';
  local_e0._M_p = (pointer)&local_d0;
  local_d0._M_allocated_capacity = 0x6d65702e74726563;
  local_d8 = 8;
  local_d0._M_local_buf[8] = '\0';
  puVar10 = &stack0xfffffffffffffe38;
  puVar9 = puVar10;
  local_150._0_4_ = iVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffe28,in_stack_fffffffffffffe68,
             in_stack_fffffffffffffe70 + in_stack_fffffffffffffe68);
  std::__cxx11::string::append(&stack0xfffffffffffffe28);
  std::__cxx11::string::operator=((string *)&local_138,(string *)&stack0xfffffffffffffe28);
  if (puVar9 != puVar10) {
    operator_delete(puVar9,in_stack_fffffffffffffe38 + 1);
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffe28,"");
  plVar6 = (long *)&stack0xfffffffffffffe58;
  plVar11 = plVar6;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffe48,"index.html","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_118,
             &stack0xfffffffffffffe28,&stack0xfffffffffffffe68);
  lVar7 = -0x40;
  do {
    if (plVar6 != (long *)plVar6[-2]) {
      operator_delete((long *)plVar6[-2],*plVar6 + 1);
    }
    plVar6 = plVar6 + -4;
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0);
  Incppect<false>::getInstance();
  Incppect<false>::Parameters::Parameters(&local_c0,(Parameters *)local_150);
  PVar1.tLastRequestTimeout_ms._4_4_ = in_stack_fffffffffffffe24;
  PVar1._0_12_ = in_stack_fffffffffffffe18;
  PVar1._16_8_ = puVar10;
  PVar1.httpRoot._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe30;
  PVar1.httpRoot._M_string_length = in_stack_fffffffffffffe38;
  PVar1.httpRoot.field_2._M_allocated_capacity = in_stack_fffffffffffffe40;
  PVar1.httpRoot.field_2._8_8_ = plVar11;
  PVar1.resources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffe50;
  PVar1.sslKey._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe68;
  PVar1.sslKey._M_string_length = in_stack_fffffffffffffe70;
  PVar1.sslKey.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffe78;
  PVar1.sslCert._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffe88;
  PVar1.sslCert._4_28_ = in_stack_fffffffffffffe8c;
  Incppect<false>::runAsync(PVar1);
  std::thread::detach();
  if (puVar10 != (undefined1 *)0x0) {
    std::terminate();
  }
  Incppect<false>::Parameters::~Parameters(&local_c0);
  fVar8 = 0.0;
  do {
    if (fVar8 < in_stack_fffffffffffffe88) {
      printf(" - Simulating 3D elastic collisions at t = %4.2f ...\n",
             SUB84((double)in_stack_fffffffffffffe88,0));
      fVar8 = fVar8 + 1.0;
    }
    State::update((State *)&stack0xfffffffffffffe88);
    do {
      iVar2 = nanosleep((timespec *)&stack0xfffffffffffffe28,(timespec *)&stack0xfffffffffffffe28);
      if (iVar2 != -1) break;
      piVar5 = __errno_location();
    } while (*piVar5 == 4);
  } while( true );
}

Assistant:

int main(int argc, char ** argv) {
	printf("Usage: %s [port] [httpRoot] [nBalls]\n", argv[0]);

    int port = argc > 1 ? atoi(argv[1]) : 3000;
    std::string httpRoot = argc > 2 ? argv[2] : "../examples";
    int nBalls = argc > 3 ? atoi(argv[3]) : 64;

    nBalls = std::max(1, std::min(128, nBalls));

    State state;
    state.init(nBalls);

    incppect::Parameters parameters;
    parameters.portListen = port;
    parameters.maxPayloadLength_bytes = 256*1024;
    parameters.httpRoot = httpRoot + "/balls3d";
    parameters.resources = { "", "index.html", };

    incppect::getInstance().runAsync(parameters).detach();

    float checkpoint = 0.0f;
    while (true) {
        if (state.t > checkpoint) {
            printf(" - Simulating 3D elastic collisions at t = %4.2f ...\n", state.t);
            checkpoint += 1.0f;
        }

        state.update();

        std::this_thread::sleep_for(std::chrono::milliseconds(1));
    }

    return 0;
}